

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::HttpServer::SuspendedRequest> * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::operator=
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,
          NullableValue<kj::HttpServer::SuspendedRequest> *other)

{
  SuspendedRequest *params;
  NullableValue<kj::HttpServer::SuspendedRequest> *other_local;
  NullableValue<kj::HttpServer::SuspendedRequest> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::HttpServer::SuspendedRequest>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::HttpServer::SuspendedRequest>(&(other->field_1).value);
      ctor<kj::HttpServer::SuspendedRequest,kj::HttpServer::SuspendedRequest>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }